

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<void>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_qpromise_finally::fulfilledThrows_void()::__0>
               (QPromiseResolve<void> *resolve)

{
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  
  tst_qpromise_finally::fulfilledThrows_void::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&resolve_local + 7));
  QtPromise::QPromiseResolve<void>::operator()(resolve);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            fn(std::forward<Args>(args)...);
            resolve();
        } catch (...) {
            reject(std::current_exception());
        }
    }